

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_reader.c
# Opt level: O3

int dlep_reader_lid_length_tlv(uint16_t *length,dlep_session *session,dlep_parser_value *value)

{
  ushort uVar1;
  
  if ((value == (dlep_parser_value *)0x0) &&
     (value = dlep_session_get_tlv_value(session,0x16), value == (dlep_parser_value *)0x0)) {
    return -1;
  }
  uVar1 = *(ushort *)((session->parser).tlv_ptr + value->index);
  *length = uVar1 << 8 | uVar1 >> 8;
  return 0;
}

Assistant:

int
dlep_reader_lid_length_tlv(uint16_t *length, struct dlep_session *session, struct dlep_parser_value *value) {
  const uint8_t *ptr;
  uint16_t tmp16;
  if (!value) {
    value = dlep_session_get_tlv_value(session, DLEP_LID_LENGTH_TLV);
    if (!value) {
      return -1;
    }
  }

  ptr = dlep_session_get_tlv_binary(session, value);
  memcpy(&tmp16, ptr, sizeof(tmp16));
  *length = ntohs(tmp16);

  return 0;
}